

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::BuildReservedRange
          (DescriptorBuilder *this,EnumReservedRange *proto,EnumDescriptor *parent,
          ReservedRange *result,FlatAllocator *param_4)

{
  string_view element_name;
  int32_t iVar1;
  DescriptorStringView this_00;
  FlatAllocator *param_4_local;
  ReservedRange *result_local;
  EnumDescriptor *parent_local;
  EnumReservedRange *proto_local;
  DescriptorBuilder *this_local;
  
  iVar1 = EnumDescriptorProto_EnumReservedRange::start(proto);
  result->start = iVar1;
  iVar1 = EnumDescriptorProto_EnumReservedRange::end(proto);
  result->end = iVar1;
  if (result->end < result->start) {
    this_00 = EnumDescriptor::full_name_abi_cxx11_(parent);
    element_name = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00);
    AddError(this,element_name,&proto->super_Message,NUMBER,
             "Reserved range end number must be greater than start number.");
  }
  return;
}

Assistant:

void DescriptorBuilder::BuildReservedRange(
    const EnumDescriptorProto::EnumReservedRange& proto,
    const EnumDescriptor* parent, EnumDescriptor::ReservedRange* result,
    internal::FlatAllocator&) {
  result->start = proto.start();
  result->end = proto.end();

  if (result->start > result->end) {
    AddError(parent->full_name(), proto, DescriptorPool::ErrorCollector::NUMBER,
             "Reserved range end number must be greater than start number.");
  }
}